

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O2

void __thiscall CTestResource_TestMSAA_Test::TestBody(CTestResource_TestMSAA_Test *this)

{
  int iVar1;
  _Tuple_impl<5UL,_int> _Var2;
  bool bVar3;
  pointer ptVar4;
  ulong uVar5;
  GMM_RESOURCE_FORMAT GVar6;
  undefined1 auVar7 [8];
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  TEST_MSAA MSAA;
  ulong uVar13;
  double dVar14;
  undefined1 auStack_128 [8];
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  List;
  GMM_RESCREATE_PARAMS local_f8;
  uint32_t local_74;
  TEST_MSAA local_70;
  uint32_t ExpectedMCSBpp;
  ulong local_68;
  double local_60;
  ulong local_58;
  uint32_t local_50;
  uint32_t local_4c;
  uint32_t MCSHAlign;
  uint32_t MCSVAlign;
  uint32_t VAlign;
  uint32_t TileDimY;
  uint32_t HAlign;
  byte local_31;
  uint32_t TileDimX;
  
  auStack_128 = (undefined1  [8])0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BuildInputIterator((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                      *)auStack_128,3,2,false);
  ptVar4 = List.
           super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar7 = auStack_128;
  do {
    if (auVar7 == (undefined1  [8])ptVar4) {
      std::
      _Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
      ::~_Vector_base((_Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                       *)auStack_128);
      return;
    }
    _Var2.super__Head_base<5UL,_int,_false>._M_head_impl =
         (((pointer)auVar7)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
         super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
         super__Tuple_impl<4UL,_int,_int>.super__Tuple_impl<5UL,_int>.
         super__Head_base<5UL,_int,_false>;
    List.
    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(long)(((pointer)auVar7)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
                        super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
                        super__Tuple_impl<2UL,_int,_bool,_int,_int>.
                        super__Tuple_impl<3UL,_bool,_int,_int>.super__Tuple_impl<4UL,_int,_int>.
                        super__Head_base<4UL,_int,_false>._M_head_impl;
    local_31 = (((pointer)auVar7)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
               super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
               super__Head_base<3UL,_bool,_false>._M_head_impl;
    uVar10 = (((pointer)auVar7)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Head_base<1UL,_int,_false>.
             _M_head_impl;
    local_68 = (ulong)uVar10;
    TileDimY = (((pointer)auVar7)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Head_base<0UL,_int,_false>._M_head_impl;
    local_f8.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    local_f8.MultiTileArch._0_1_ = 0;
    local_f8.MultiTileArch.GpuVaMappingSet = '\0';
    local_f8.MultiTileArch.LocalMemEligibilitySet = '\0';
    local_f8.MultiTileArch.LocalMemPreferredSet = '\0';
    local_f8.MultiTileArch.Reserved = 0;
    local_f8.ExistingSysMemSize = 0;
    local_f8.MaximumRenamingListLength = 0;
    local_f8.NoGfxMemory = '\0';
    local_f8._109_3_ = 0;
    local_f8.RotateInfo = 0;
    local_f8._84_4_ = 0;
    local_f8.pExistingSysMem = 0;
    local_f8.MaxLod = 0;
    local_f8.ArraySize = 0;
    local_f8.BaseAlignment = 0;
    local_f8.OverridePitch = 0;
    local_f8.field_6.BaseWidth64 = 0;
    local_f8.BaseHeight = 0;
    local_f8.Depth = 0;
    local_f8.MSAA.NumSamples = 0;
    local_f8.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    local_f8.CpTag = 0;
    local_f8._44_4_ = 0;
    local_f8.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    local_f8.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    local_f8.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    local_f8.Type = RESOURCE_INVALID;
    local_f8.Format = GMM_FORMAT_INVALID;
    local_f8.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    if ((int)TileDimY < 3 &&
        (((pointer)auVar7)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
        super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_bool,_int,_int>
        .super__Head_base<2UL,_int,_false>._M_head_impl == 1) {
      uVar13 = 0x800000;
      if ((local_31 & 1) == 0) {
        uVar13 = 0x40;
        if (1 < uVar10 - 1 || TileDimY == TEST_TILEX) goto LAB_0016bde6;
      }
      CTestResource::SetTileFlag(&this->super_CTestResource,&local_f8,TileDimY);
      uVar5 = local_68;
      local_f8.Type = RESOURCE_2D;
      local_f8.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)local_f8.Flags.Gpu & 0xffffffffff7fffbf | uVar13);
      local_f8.ArraySize =
           *(uint32_t *)
            (&DAT_0018f0a8 + (long)(int)_Var2.super__Head_base<5UL,_int,_false>._M_head_impl * 4);
      local_f8.NoGfxMemory = '\x01';
      GVar6 = CTestResource::SetResourceFormat(&this->super_CTestResource,(TEST_BPP)local_68);
      local_60 = (double)(uVar5 & 0xffffffff);
      local_f8.Format = GVar6;
      ExpectedMCSBpp = local_31 & 1;
      for (MSAA = MSAA_2x; MSAA != MSAA_16x; MSAA = MSAA + MSAA_2x) {
        CTestResource::GetAlignmentAndTileDimensionsForMSAA
                  (&this->super_CTestResource,(TEST_BPP)local_68,SUB41(ExpectedMCSBpp,0),TileDimY,
                   MSAA,&HAlign,&MCSVAlign,&VAlign,&MCSHAlign,&local_74,&local_50,&local_4c);
        local_f8.field_6.BaseWidth =
             HAlign * *(int *)(&DAT_0018f090 +
                              (long)List.
                                    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 8) + 1;
        local_f8.field_6.BaseWidth64._4_4_ = 0;
        local_f8.Depth = 1;
        local_f8.BaseHeight =
             MCSVAlign *
             *(int *)(&DAT_0018f094 +
                     (long)List.
                           super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage * 8) + 1;
        dVar14 = exp2((double)(int)MSAA);
        local_f8.MSAA.NumSamples = (uint32_t)(long)dVar14;
        local_f8.Flags.Gpu =
             (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_f8.Flags.Gpu & 0xffffffffffff7fff);
        local_f8.ArraySize = 1;
        ResourceInfo = (GMM_RESOURCE_INFO *)
                       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                 (CommonULT::pGmmULTClientContext,&local_f8);
        if (ResourceInfo != (GMM_RESOURCE_INFO *)0x0) {
          CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,ResourceInfo,VAlign);
          CTestResource::VerifyResourceVAlign<true>
                    (&this->super_CTestResource,ResourceInfo,MCSHAlign);
          local_70 = MSAA;
          if ((local_31 & 1) == 0) {
            if (MSAA == MSAA_8x) {
              bVar3 = true;
              iVar9 = 4;
              local_58 = 2;
LAB_0016c0ae:
              local_f8.field_6.BaseWidth64 = local_f8.field_6.BaseWidth64 + 1 & 0xfffffffffffffffe;
            }
            else {
              if (MSAA == MSAA_4x) {
                bVar3 = true;
LAB_0016c09f:
                local_58 = (ulong)MSAA;
                iVar9 = 2;
                goto LAB_0016c0ae;
              }
              if (MSAA == MSAA_2x) {
                bVar3 = false;
                goto LAB_0016c09f;
              }
              bVar3 = false;
              local_58 = 1;
              iVar9 = 1;
            }
            uVar10 = local_f8.BaseHeight + 1 & 0xfffffffe;
            if (!bVar3) {
              uVar10 = local_f8.BaseHeight;
            }
            local_f8.BaseHeight = uVar10;
            uVar8 = local_f8.field_6.BaseWidth;
            iVar1 = VAlign - 1;
            uVar10 = -VAlign;
            dVar14 = exp2(local_60);
            iVar11 = (int)(long)dVar14 * (uVar10 & iVar1 + uVar8 * iVar9) + HAlign;
            iVar9 = iVar9 * local_f8.field_6.BaseWidth;
            iVar1 = VAlign - 1;
            uVar10 = -VAlign;
            dVar14 = exp2(local_60);
            uVar8 = ~((int)(long)dVar14 * (uVar10 & iVar1 + iVar9) + -1 + HAlign & HAlign - 1) +
                    iVar11;
            CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,uVar8);
            if (TileDimY != 0) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        (&this->super_CTestResource,ResourceInfo,uVar8 / HAlign);
            }
            uVar10 = -MCSHAlign & (MCSHAlign - 1) + (int)local_58 * local_f8.BaseHeight;
            if (1 < local_f8.ArraySize) {
              CTestResource::VerifyResourceQPitch<true>
                        (&this->super_CTestResource,ResourceInfo,(ulong)uVar10);
            }
            CTestResource::VerifyResourceSize<true>
                      (&this->super_CTestResource,ResourceInfo,
                       (ulong)((-MCSVAlign & (MCSVAlign - 1) + local_f8.ArraySize * uVar10) * uVar8
                               + 0xfff & 0xfffff000));
          }
          else {
            uVar10 = (VAlign - 1) + local_f8.field_6.BaseWidth;
            uVar12 = -VAlign;
            dVar14 = exp2(local_60);
            iVar9 = (int)(long)dVar14 * (uVar12 & uVar10) + HAlign;
            uVar10 = (VAlign - 1) + local_f8.field_6.BaseWidth;
            uVar12 = -VAlign;
            dVar14 = exp2(local_60);
            uVar8 = ~((int)(long)dVar14 * (uVar12 & uVar10) + -1 + HAlign & HAlign - 1) + iVar9;
            CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,uVar8);
            if (TileDimY != 0) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        (&this->super_CTestResource,ResourceInfo,uVar8 / HAlign);
            }
            uVar10 = -MCSHAlign & (local_f8.BaseHeight - 1) + MCSHAlign;
            CTestResource::VerifyResourceQPitch<true>
                      (&this->super_CTestResource,ResourceInfo,(ulong)uVar10);
            CTestResource::VerifyResourceSize<true>
                      (&this->super_CTestResource,ResourceInfo,
                       (ulong)((-MCSVAlign &
                               (MCSVAlign - 1) +
                               uVar10 * local_f8.MSAA.NumSamples * local_f8.ArraySize) * uVar8 +
                               0xfff & 0xfffff000));
          }
          local_f8.Flags.Gpu =
               (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_f8.Flags.Gpu | 0x8000);
          ResourceInfo_00 =
               (GMM_RESOURCE_INFO *)
               (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                         (CommonULT::pGmmULTClientContext,&local_f8);
          CTestResource::VerifyResourceHAlign<true>
                    (&this->super_CTestResource,ResourceInfo_00,local_50);
          CTestResource::VerifyResourceVAlign<true>
                    (&this->super_CTestResource,ResourceInfo_00,local_4c);
          uVar12 = (-local_50 & (local_50 - 1) + local_f8.field_6.BaseWidth) * local_74 + 0x7f;
          uVar10 = uVar12 & 0xffffff80;
          CTestResource::VerifyResourcePitch<true>
                    (&this->super_CTestResource,ResourceInfo_00,uVar10);
          CTestResource::VerifyResourcePitchInTiles<true>
                    (&this->super_CTestResource,ResourceInfo_00,uVar12 >> 7);
          uVar8 = local_f8.BaseHeight;
          if (1 < local_f8.ArraySize) {
            uVar8 = -local_4c & (local_f8.BaseHeight - 1) + local_4c;
            CTestResource::VerifyResourceQPitch<true>
                      (&this->super_CTestResource,ResourceInfo_00,(ulong)uVar8);
          }
          CTestResource::VerifyResourceSize<true>
                    (&this->super_CTestResource,ResourceInfo_00,
                     (ulong)((local_f8.ArraySize * uVar8 + 0x1f & 0xffffffe0) * uVar10));
          MSAA = local_70;
          (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                    (CommonULT::pGmmULTClientContext,ResourceInfo_00);
        }
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,ResourceInfo);
      }
    }
LAB_0016bde6:
    auVar7 = (undefined1  [8])((long)auVar7 + 0x18);
  } while( true );
}

Assistant:

TEST_F(CTestResource, TestMSAA)
{
    enum MSAA_Samples
    {
        MSAA_None,
        MSAA_2x,
        MSAA_4x,
        MSAA_8x,
        MSAA_16x
    };

    const uint32_t MCSTileSize[1][2] = {128, 32}; //MCS is TileY

    //Gen8:No mip-map for MSAA (MSS and MCS), No 16x
    //No MSAA for YUV/compressed formats
    //Interleaved MSS (IMS) for Depth/Stencil. Arrayed MSS (CMS) for Color RT
    //QPitch exists for arrayed MSS - gives distance between slices
    //MSS (Arrayed): px_wL, px_hL = pixel width/height of single sample at Lod L
    //                 MSS width = px_wL, MSS height = NumSamples*px_hL
    //MSS (Interleaved): px_wL, px_hL = pixel width/height of single sample at Lod L
    // Samples         MSS width                MSS Height
    //   2x            4*ceil(px_wL/2)             px_hL
    //   4x            4*ceil(px_wL/2)           4*ceil(px_hL/2)
    //   8x            8*ceil(px_wL/2)           4*ceil(px_hL/2)
    //  16x            8*ceil(px_wL/2)           8*ceil(px_hL/2)
    //MCS (bpp): 2x/4x - bpp_8, 8x - bpp_32, 16x - bpp_64

    const uint32_t TestDimensions[3][2] = {
    {0, 0}, //1x1x1
    {1, 0}, //2 Tilesx1
    {1, 1}, //2 Tilesx 2
    };

    uint32_t TestArraySize[2] = {1, 7};

    uint32_t HAlign, VAlign, TileDimX, TileDimY, MCSHAlign, MCSVAlign, TileSize;
    uint32_t ExpectedMCSBpp;

    std::vector<std::tuple<int, int, int, bool, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, Depth or RT, TestDimension index, TestArraySize index
    auto Size = BuildInputIterator(List, 3, 2, false);                  // Size of arrays TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        bool               IsRT       = std::get<3>(element); // True for RT, False for Depth
        int                TestDimIdx = std::get<4>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<5>(element); //index into TestArraySize
        TileSize                      = GMM_KBYTE(4);

        //Discard un-supported Tiling/Res_type/bpp for this test
        if(ResType != TEST_RESOURCE_2D || Tiling > TEST_TILEY           //No 1D/3D/Cube. Supported 2D mip-maps/array
           || (!IsRT && (Tiling == TEST_TILEX ||
                         !(Bpp == TEST_BPP_16 || Bpp == TEST_BPP_32)))) //depth supported on 16bit, 32bit formats only
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, IsRT);
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);
        for(uint32_t k = MSAA_2x; k < MSAA_16x; k++) //No 16x MSAA on Gen8
        {
            GetAlignmentAndTileDimensionsForMSAA(Bpp, IsRT, Tiling, (TEST_MSAA)k,
                                                 TileDimX, TileDimY, HAlign, VAlign,
                                                 ExpectedMCSBpp, MCSHAlign, MCSVAlign);

            gmmParams.BaseWidth64 = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
            gmmParams.BaseHeight  = TestDimensions[TestDimIdx][1] * TileDimY + 0x1;

            gmmParams.Depth           = 0x1; //2D Res_type with Depth > 1 doesn't fail, although Tex_cacl doesn't use it
            gmmParams.MSAA.NumSamples = static_cast<uint32_t>(pow((double)2, k));
            gmmParams.Flags.Gpu.MCS   = 0;
            gmmParams.ArraySize       = 1;

            //MSS surface
            GMM_RESOURCE_INFO *MSSResourceInfo;
            MSSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            if(MSSResourceInfo)
            {
                VerifyResourceHAlign<true>(MSSResourceInfo, HAlign);
                VerifyResourceVAlign<true>(MSSResourceInfo, VAlign);
                if(IsRT) //Arrayed MSS
                {
                    uint32_t ExpectedPitch = 0, ExpectedQPitch = 0;
                    ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); // Aligned width * bpp, aligned to TileWidth
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);

                    //if (gmmParams.ArraySize > 1) - Arrayed MSS has QPitch
                    {
                        ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }

                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.MSAA.NumSamples * gmmParams.ArraySize, TileDimY); //Align Height =ExpectedPitch * NumSamples * ExpectedQPitch, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));
                }
                else // Interleaved MSS
                {
                    uint32_t WidthMultiplier, HeightMultiplier;
                    GetInterleaveMSSPattern((TEST_MSAA)k, WidthMultiplier, HeightMultiplier, IsRT, Bpp);
                    gmmParams.BaseWidth64 = WidthMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseWidth64, 2) : gmmParams.BaseWidth64;
                    gmmParams.BaseHeight  = HeightMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseHeight, 2) : gmmParams.BaseHeight;

                    uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64 * WidthMultiplier, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); //AlignedWidth*bpp, then align to Tile
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                    {
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX); // 1 tileY wide
                    }

                    uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight * HeightMultiplier, VAlign);
                    if(gmmParams.ArraySize > 1)
                    {
                        // it needs to be in VALign multiple
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }
                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, TileDimY);            //Align Height = ExpectedQPitch*ArraySize, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize)); //ExpectedPitch *ExpectedHeight
                }
            }

            //No MCS surface if MSS creation failed
            if(MSSResourceInfo)
            {
                gmmParams.Flags.Gpu.MCS = 1;
                GMM_RESOURCE_INFO *MCSResourceInfo;
                MCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

                VerifyResourceHAlign<true>(MCSResourceInfo, MCSHAlign); // MCS alignment same as basic RT alignment
                VerifyResourceVAlign<true>(MCSResourceInfo, MCSVAlign);

                uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, MCSHAlign) * ExpectedMCSBpp, MCSTileSize[0][0]); //AlignedWidth*bpp, then tile-alignment
                VerifyResourcePitch<true>(MCSResourceInfo, ExpectedPitch);
                VerifyResourcePitchInTiles<true>(MCSResourceInfo, ExpectedPitch / MCSTileSize[0][0]);

                uint32_t ExpectedQPitch = gmmParams.BaseHeight;
                if(gmmParams.ArraySize > 1)
                {
                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign); //QPitch only for array
                    VerifyResourceQPitch<true>(MCSResourceInfo, ExpectedQPitch);
                }

                uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, MCSTileSize[0][1]);
                VerifyResourceSize<true>(MCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));

                pGmmULTClientContext->DestroyResInfoObject(MCSResourceInfo);
            } //MCS

            pGmmULTClientContext->DestroyResInfoObject(MSSResourceInfo);
        } //NumSamples = k
    }     //Iterate through all input tuples
}